

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>::Resize
          (TPZVec<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
           *this,int64_t newsize,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *object)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ostream *this_00;
  ulong uVar4;
  long lVar5;
  ulong in_RSI;
  long in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t large;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *newstore;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff68;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff70;
  ulong local_68;
  ulong *local_50;
  long local_30;
  ulong *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (ulong *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RSI;
      uVar4 = SUB168(auVar3 * ZEXT816(0x30),0);
      uVar6 = uVar4 + 8;
      if (SUB168(auVar3 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
        uVar6 = 0xffffffffffffffff;
      }
      local_20 = (ulong *)operator_new__(uVar6);
      *local_20 = in_RSI;
      local_20 = local_20 + 1;
      if (in_RSI != 0) {
        local_50 = local_20;
        do {
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x1f393bf);
          local_50 = local_50 + 6;
        } while (local_50 != local_20 + in_RSI * 6);
      }
    }
    local_68 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_68 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_30 = 0; local_30 < (long)local_68; local_30 = local_30 + 1) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    for (; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      lVar1 = *(long *)(in_RDI + 8);
      if (lVar1 != 0) {
        lVar2 = *(long *)(lVar1 + -8);
        lVar5 = lVar1 + lVar2 * 0x30;
        while (lVar1 != lVar5) {
          lVar5 = lVar5 + -0x30;
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x1f39511);
        }
        operator_delete__((void *)(lVar1 + -8),lVar2 * 0x30 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(ulong **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}